

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qresource.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_454c1b::QDynamicFileResourceRoot::~QDynamicFileResourceRoot
          (QDynamicFileResourceRoot *this)

{
  ~QDynamicFileResourceRoot(this);
  operator_delete(this,0x70);
  return;
}

Assistant:

~QDynamicFileResourceRoot() {
        if (wasMemoryMapped())
            unmap_sys(unmapPointer, unmapLength);
        else
            delete[] mappingBuffer();
    }